

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

string * __thiscall
czh::file::NonStreamFile::get_spec_line_abi_cxx11_
          (string *__return_storage_ptr__,NonStreamFile *this,size_t beg,size_t end,
          size_t linenosize)

{
  bool bVar1;
  char cVar2;
  ulong __val;
  bool bVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string addition;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = true;
  __val = 1;
  uVar4 = 0;
  bVar3 = true;
  while ((uVar4 < (this->code)._M_string_length && (__val < end))) {
    cVar2 = (this->code)._M_dataplus._M_p[uVar4];
    if (cVar2 == '\n') {
      __val = __val + 1;
      bVar1 = true;
    }
    else if (beg <= __val) {
      if (bVar1) {
        std::__cxx11::to_string(&addition,__val);
        if (addition._M_string_length <= linenosize && linenosize - addition._M_string_length != 0)
        {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_70,linenosize - addition._M_string_length,'0');
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
        if (!bVar3) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,'\n');
        }
        std::operator+(&local_70,&addition,"| ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&addition);
        cVar2 = (this->code)._M_dataplus._M_p[uVar4];
        bVar3 = false;
      }
      if (cVar2 != '\r') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,cVar2);
      }
      bVar1 = false;
    }
    uVar4 = uVar4 + 1;
  }
  while ((cVar2 = (__return_storage_ptr__->_M_dataplus)._M_p
                  [__return_storage_ptr__->_M_string_length - 1], cVar2 == '\r' || (cVar2 == '\n')))
  {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string get_spec_line(std::size_t beg, std::size_t end, std::size_t linenosize) const override
    {
      std::size_t lineno = 1;
      bool first_line_flag = true;
      bool first_line_no = true;
      std::string ret;
      for (std::size_t i = 0; i < code.size() && lineno < end; ++i)
      {
        if (code[i] == '\n')
        {
          ++lineno;
          first_line_flag = true;
          continue;
        }
        if (lineno >= beg)
        {
          if (first_line_flag)
          {
            std::string addition = utils::to_str(lineno);
            if (addition.size() < linenosize)
              ret += std::string(linenosize - addition.size(), '0');
            if (!first_line_no)
              ret += '\n';
            else
              first_line_no = false;
            ret += addition + "| ";
            first_line_flag = false;
          }
          if (code[i] != '\r')
            ret += code[i];
        }
      }
      while (ret.back() == '\r' || ret.back() == '\n')
      {
        ret.pop_back();
      }
      return ret;
    }